

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  ostream *poVar2;
  pointer pcVar3;
  char *m1;
  string local_1f0 [32];
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_1d0;
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_1c8;
  const_iterator i;
  string local_1b0;
  undefined1 local_190 [8];
  ostringstream msg;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  GetExecutionFilePath_abi_cxx11_(&local_1b0,this);
  poVar2 = std::operator<<((ostream *)local_190,(string *)&local_1b0);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(lff->super_cmListFileContext).Line);
  std::operator<<(poVar2,"):  ");
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar2 = std::operator<<((ostream *)local_190,(string *)lff);
  std::operator<<(poVar2,"(");
  local_1c8._M_current =
       (cmListFileArgument *)
       std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(&lff->Arguments);
  while( true ) {
    local_1d0._M_current =
         (cmListFileArgument *)
         std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(&lff->Arguments);
    bVar1 = __gnu_cxx::operator!=(&local_1c8,&local_1d0);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
             ::operator->(&local_1c8);
    std::operator<<((ostream *)local_190,(string *)pcVar3);
    std::operator<<((ostream *)local_190," ");
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&local_1c8);
  }
  std::operator<<((ostream *)local_190,")");
  std::__cxx11::ostringstream::str();
  m1 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::Message(m1,(char *)0x0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  std::ostringstream msg;
  msg << this->GetExecutionFilePath() << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  for(std::vector<cmListFileArgument>::const_iterator i =
        lff.Arguments.begin(); i != lff.Arguments.end(); ++i)
    {
    msg << i->Value;
    msg << " ";
    }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}